

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

string * __thiscall
PacketProcessor::Encode(string *__return_storage_ptr__,PacketProcessor *this,string *rawstr)

{
  long lVar1;
  char *pcVar2;
  pointer pcVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  string str;
  string local_38;
  
  if ((this->emulti_e == '\0') ||
     ((pcVar3 = (rawstr->_M_dataplus)._M_p, pcVar3[2] == -1 && (pcVar3[3] == -1)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (rawstr->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + rawstr->_M_string_length);
  }
  else {
    DickWinder(&local_38,rawstr,this->emulti_e);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize
              ((ulong)__return_storage_ptr__,(char)(uint)local_38._M_string_length);
    *(__return_storage_ptr__->_M_dataplus)._M_p = *local_38._M_dataplus._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p[1] = local_38._M_dataplus._M_p[1];
    lVar4 = 2;
    if (2 < (int)(uint)local_38._M_string_length) {
      lVar9 = 2;
      do {
        lVar4 = lVar9 + 1;
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar9 * 2 + -2] =
             local_38._M_dataplus._M_p[lVar9] + -0x80;
        lVar1 = ~(ulong)((uint)local_38._M_string_length - 3 >> 1) + lVar9;
        lVar9 = lVar4;
      } while (lVar1 != 1);
    }
    uVar5 = ~((uint)local_38._M_string_length & 1) + (uint)local_38._M_string_length;
    if (1 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
      iVar8 = ((uint)local_38._M_string_length - ((uint)local_38._M_string_length & 1)) + 1;
      do {
        pcVar2 = local_38._M_dataplus._M_p + lVar4;
        lVar4 = lVar4 + 1;
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar6] = *pcVar2 + -0x80;
        uVar6 = uVar6 - 2;
        iVar8 = iVar8 + -2;
      } while (3 < iVar8);
    }
    if (2 < (int)(uint)local_38._M_string_length) {
      uVar6 = 2;
      do {
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        cVar7 = pcVar3[uVar6];
        if (cVar7 == -0x80) {
          cVar7 = '\0';
LAB_001815b7:
          pcVar3[uVar6] = cVar7;
        }
        else if (cVar7 == '\0') {
          cVar7 = -0x80;
          goto LAB_001815b7;
        }
        uVar6 = uVar6 + 1;
      } while (((uint)local_38._M_string_length & 0x7fffffff) != uVar6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::Encode(const std::string &rawstr)
{
	if (emulti_e == 0 || ((unsigned char)rawstr[2] == PACKET_A_INIT && (unsigned char)rawstr[3] == PACKET_F_INIT))
		return rawstr;

	std::string str = this->DickWinderE(rawstr);
	std::string newstr;
	int length = str.length();
	int i = 2;
	int ii = 2;

	newstr.resize(length);

	newstr[0] = str[0];
	newstr[1] = str[1];

	while (i < length)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i += 2;
	}

	i = length - 1;

	if (length % 2)
	{
		--i;
	}

	while (i >= 2)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i -= 2;
	}

	for (int i = 2; i < length; ++i)
	{
		if (static_cast<unsigned char>(newstr[i]) == 128)
		{
			newstr[i] = 0;
		}
		else if (newstr[i] == 0)
		{
			newstr[i] = 128;
		}
	}

	return newstr;
}